

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

Gia_RsbMan_t *
Gia_RsbAlloc(Gia_Man_t *pGia,word *pOffSet,word *pOnSet,Vec_Wrd_t *vSims,int nWords,
            Vec_Wrd_t *vSimsT,int nWordsT,Vec_Int_t *vCands)

{
  int *piVar1;
  int iVar2;
  Gia_RsbMan_t *pGVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Wec_t *p;
  Vec_Wec_t *p_00;
  word *pwVar6;
  word *pwVar7;
  Vec_Int_t **ppVVar8;
  ulong uVar9;
  ulong uVar10;
  Vec_Wec_t *pVVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  int *piVar15;
  size_t __nmemb;
  Vec_Int_t **ppVVar16;
  int iVar17;
  Vec_Int_t **ppVVar18;
  
  pGVar3 = (Gia_RsbMan_t *)calloc(1,0x78);
  if (0x400 < nWords) {
    __assert_fail("nWords <= 1024",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x563,
                  "Gia_RsbMan_t *Gia_RsbAlloc(Gia_Man_t *, word *, word *, Vec_Wrd_t *, int, Vec_Wrd_t *, int, Vec_Int_t *)"
                 );
  }
  if (vSims->nSize != nWords * 0x40 * nWordsT) {
    __assert_fail("Vec_WrdSize(vSims) == 64 * nWords * nWordsT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x564,
                  "Gia_RsbMan_t *Gia_RsbAlloc(Gia_Man_t *, word *, word *, Vec_Wrd_t *, int, Vec_Wrd_t *, int, Vec_Int_t *)"
                 );
  }
  if (vSims->nSize != vSimsT->nSize) {
    __assert_fail("Vec_WrdSize(vSims) == Vec_WrdSize(vSimsT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x565,
                  "Gia_RsbMan_t *Gia_RsbAlloc(Gia_Man_t *, word *, word *, Vec_Wrd_t *, int, Vec_Wrd_t *, int, Vec_Int_t *)"
                 );
  }
  pGVar3->pGia = pGia;
  pGVar3->pOffSet = pOffSet;
  pGVar3->pOnSet = pOnSet;
  pGVar3->nWords = nWords;
  pGVar3->nWordsT = nWordsT;
  pGVar3->vSims = vSims;
  pGVar3->vSimsT = vSimsT;
  pGVar3->vCands = vCands;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar4->pArray = piVar5;
  pGVar3->vObjs = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar4->pArray = piVar5;
  pGVar3->vObjs2 = pVVar4;
  p = (Vec_Wec_t *)malloc(0x10);
  p->nCap = 0x400;
  p->nSize = 0;
  pVVar4 = (Vec_Int_t *)calloc(0x400,0x10);
  p->pArray = pVVar4;
  pGVar3->vSets[0] = p;
  p_00 = (Vec_Wec_t *)malloc(0x10);
  p_00->nCap = 0x400;
  p_00->nSize = 0;
  pVVar4 = (Vec_Int_t *)calloc(0x400,0x10);
  p_00->pArray = pVVar4;
  pGVar3->vSets[1] = p_00;
  __nmemb = (size_t)nWordsT;
  pwVar6 = (word *)calloc(__nmemb,8);
  pGVar3->pSet[0] = pwVar6;
  pwVar7 = (word *)calloc(__nmemb,8);
  pGVar3->pSet[1] = pwVar7;
  pwVar7 = (word *)calloc(__nmemb,8);
  pGVar3->pSet[2] = pwVar7;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar4->pArray = piVar5;
  pGVar3->vActive = pVVar4;
  iVar17 = vCands->nSize;
  if (0 < (long)iVar17) {
    piVar5 = vCands->pArray;
    lVar14 = 0;
    do {
      iVar2 = piVar5[lVar14];
      if (nWordsT * 0x40 <= iVar2) {
        __assert_fail("iObj < nWordsT * 64",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                      ,0x578,
                      "Gia_RsbMan_t *Gia_RsbAlloc(Gia_Man_t *, word *, word *, Vec_Wrd_t *, int, Vec_Wrd_t *, int, Vec_Int_t *)"
                     );
      }
      pwVar6[iVar2 >> 6] = pwVar6[iVar2 >> 6] | 1L << ((byte)iVar2 & 0x3f);
      lVar14 = lVar14 + 1;
    } while (iVar17 != lVar14);
  }
  piVar5 = &p->nSize;
  piVar1 = &p_00->nSize;
  Vec_WecPushLevel(p);
  Vec_WecPushLevel(p_00);
  if (0 < nWords) {
    ppVVar18 = &p->pArray;
    ppVVar8 = &p_00->pArray;
    uVar13 = 0;
    do {
      uVar9 = pOffSet[uVar13 >> 6] >> ((byte)uVar13 & 0x3f);
      uVar10 = 1L << ((byte)uVar13 & 0x3f) & pOnSet[uVar13 >> 6];
      if (((pOffSet[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0) || (uVar10 != 0)) {
        if (((uVar9 & 1) == 0) && (uVar10 != 0)) {
          ppVVar16 = ppVVar8;
          if (*piVar1 < 1) {
            iVar17 = p_00->nCap;
            piVar15 = piVar1;
            if (iVar17 < 1) {
              if (*ppVVar8 == (Vec_Int_t *)0x0) {
                pVVar4 = (Vec_Int_t *)malloc(0x10);
              }
              else {
                pVVar4 = (Vec_Int_t *)realloc(*ppVVar8,0x10);
                iVar17 = p_00->nCap;
              }
              *ppVVar8 = pVVar4;
              pVVar11 = p_00;
              goto LAB_007d7646;
            }
            goto LAB_007d7670;
          }
          goto LAB_007d7682;
        }
        if (((uVar9 & 1) != 0) && (uVar10 != 0)) {
          __assert_fail("!Value0 || !Value1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                        ,0x585,
                        "Gia_RsbMan_t *Gia_RsbAlloc(Gia_Man_t *, word *, word *, Vec_Wrd_t *, int, Vec_Wrd_t *, int, Vec_Int_t *)"
                       );
        }
      }
      else {
        ppVVar16 = ppVVar18;
        if (*piVar5 < 1) {
          iVar17 = p->nCap;
          piVar15 = piVar5;
          if (iVar17 < 1) {
            if (*ppVVar18 == (Vec_Int_t *)0x0) {
              pVVar4 = (Vec_Int_t *)malloc(0x10);
            }
            else {
              pVVar4 = (Vec_Int_t *)realloc(*ppVVar18,0x10);
              iVar17 = p->nCap;
            }
            *ppVVar18 = pVVar4;
            pVVar11 = p;
LAB_007d7646:
            memset(pVVar4 + iVar17,0,(long)(1 - iVar17) << 4);
            pVVar11->nCap = 1;
          }
LAB_007d7670:
          *piVar15 = 1;
        }
LAB_007d7682:
        Vec_IntPush(*ppVVar16,(int)uVar13);
      }
      uVar12 = (int)uVar13 + 1;
      uVar13 = (ulong)uVar12;
    } while (nWords * 0x40 != uVar12);
  }
  if (*piVar5 != 1) {
    __assert_fail("Vec_WecSize(p->vSets[0]) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x587,
                  "Gia_RsbMan_t *Gia_RsbAlloc(Gia_Man_t *, word *, word *, Vec_Wrd_t *, int, Vec_Wrd_t *, int, Vec_Int_t *)"
                 );
  }
  if (*piVar1 == 1) {
    Abc_Random(1);
    return pGVar3;
  }
  __assert_fail("Vec_WecSize(p->vSets[1]) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                ,0x588,
                "Gia_RsbMan_t *Gia_RsbAlloc(Gia_Man_t *, word *, word *, Vec_Wrd_t *, int, Vec_Wrd_t *, int, Vec_Int_t *)"
               );
}

Assistant:

Gia_RsbMan_t * Gia_RsbAlloc( Gia_Man_t * pGia, word * pOffSet, word * pOnSet, Vec_Wrd_t * vSims, int nWords, Vec_Wrd_t * vSimsT, int nWordsT, Vec_Int_t * vCands )
{
    int i, iObj;
    Gia_RsbMan_t * p = ABC_CALLOC( Gia_RsbMan_t, 1 );
    assert( nWords <= 1024 );
    assert( Vec_WrdSize(vSims) == 64 * nWords * nWordsT );
    assert( Vec_WrdSize(vSims) == Vec_WrdSize(vSimsT) );
    p->pGia      = pGia;
    p->pOffSet   = pOffSet;
    p->pOnSet    = pOnSet;
    p->nWords    = nWords;
    p->nWordsT   = nWordsT;
    p->vSims     = vSims;
    p->vSimsT    = vSimsT;
    p->vCands    = vCands;
    p->vObjs     = Vec_IntAlloc( 100 );
    p->vObjs2    = Vec_IntAlloc( 100 );
    p->vSets[0]  = Vec_WecAlloc( 1024 );
    p->vSets[1]  = Vec_WecAlloc( 1024 );
    p->pSet[0]   = ABC_CALLOC( word, nWordsT );
    p->pSet[1]   = ABC_CALLOC( word, nWordsT );
    p->pSet[2]   = ABC_CALLOC( word, nWordsT );
    p->vActive   = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vCands, iObj, i )
    {
        assert( iObj < nWordsT * 64 );
        Abc_TtSetBit( p->pSet[0], iObj );
    }
    Vec_WecPushLevel( p->vSets[0] );
    Vec_WecPushLevel( p->vSets[1] );
    for ( i = 0; i < 64*nWords; i++ )
    {
        int Value0 = Abc_TtGetBit( pOffSet, i );
        int Value1 = Abc_TtGetBit( pOnSet,  i );
        if ( Value0 && !Value1 )
            Vec_WecPush( p->vSets[0], 0, i );
        else if ( !Value0 && Value1 )
            Vec_WecPush( p->vSets[1], 0, i );
        else assert( !Value0 || !Value1 );
    }
    assert( Vec_WecSize(p->vSets[0]) == 1 );
    assert( Vec_WecSize(p->vSets[1]) == 1 );
    Abc_Random( 1 );
    //Extra_PrintBinary2( stdout, (unsigned*)pOffSet, 64*nWords ); printf( "\n" );
    //Extra_PrintBinary2( stdout, (unsigned*)pOnSet,  64*nWords ); printf( "\n" );
    return p;
}